

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O1

void __thiscall miniros::network::HttpFrame::finishReqeust(HttpFrame *this)

{
  uint uVar1;
  size_type sVar2;
  pointer pcVar3;
  ulong uVar4;
  string newData;
  long *local_38 [2];
  long local_28 [2];
  
  if (this->m_state == ParseComplete) {
    uVar1 = this->m_contentLength;
    sVar2 = (this->data)._M_string_length;
    if (sVar2 != (long)(int)uVar1) {
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      pcVar3 = (this->data)._M_dataplus._M_p;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,pcVar3 + uVar4 + (long)this->m_bodyPosition,pcVar3 + sVar2);
      std::__cxx11::string::swap((string *)this);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      goto LAB_001dc969;
    }
  }
  (this->data)._M_string_length = 0;
  *(this->data)._M_dataplus._M_p = '\0';
LAB_001dc969:
  std::
  vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>::
  _M_erase_at_end(&this->fields,
                  (this->fields).
                  super__Vector_base<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  (this->requestHttpVersion).start = -1;
  (this->requestHttpVersion).end = -1;
  (this->requestType).start = -1;
  (this->requestType).end = -1;
  (this->requestUrl).start = -1;
  (this->requestUrl).end = -1;
  this->m_currentPosition = 0;
  this->m_bodyPosition = 0;
  this->m_bodyEnd = 0;
  this->m_tokenStart = 0;
  this->m_contentLength = -1;
  (this->m_fieldName).start = -1;
  (this->m_fieldName).end = -1;
  this->m_keepAlive = true;
  this->m_state = ParseRequest;
  return;
}

Assistant:

void HttpFrame::finishReqeust()
{
  if (m_state == ParseComplete) {
    size_t currentLength = m_bodyPosition;
    if (m_contentLength >= 0)
      currentLength += m_contentLength;
    if (m_contentLength  == data.size()) {
      data.clear();
    } else {
      // Truncate all data related to current request
      std::string newData(data.data() + currentLength, data.size() - currentLength);
      std::swap(data, newData);
    }
  } else {
    data.clear();
  }
  resetParseState();
}